

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strassen-lace.c
# Opt level: O0

void matrixmul(int n,REAL *A,int an,REAL *B,int bn,REAL *C,int cn)

{
  double local_50;
  REAL s;
  int local_40;
  int k;
  int j;
  int i;
  REAL *C_local;
  int bn_local;
  REAL *B_local;
  int an_local;
  REAL *A_local;
  int n_local;
  
  for (k = 0; k < n; k = k + 1) {
    for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
      local_50 = 0.0;
      for (s._4_4_ = 0; s._4_4_ < n; s._4_4_ = s._4_4_ + 1) {
        local_50 = A[k * an + s._4_4_] * B[s._4_4_ * bn + local_40] + local_50;
      }
      C[k * cn + local_40] = local_50;
    }
  }
  return;
}

Assistant:

void matrixmul(int n, REAL *A, int an, REAL *B, int bn, REAL *C, int cn)
{
    int i, j, k;
    REAL s;

    for (i = 0; i < n; ++i)
        for (j = 0; j < n; ++j) {
            s = 0.0;
            for (k = 0; k < n; ++k)
                s += ELEM(A, an, i, k) * ELEM(B, bn, k, j);

            ELEM(C, cn, i, j) = s;
        }
}